

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controls.cpp
# Opt level: O1

void __thiscall CControls::ClampMousePos(CControls *this)

{
  float fVar1;
  CGameClient *pCVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  vec2 vVar8;
  
  pCVar2 = (this->super_CComponent).m_pClient;
  if (((pCVar2->m_Snap).m_SpecInfo.m_Active == true) &&
     ((pCVar2->m_Snap).m_SpecInfo.m_UsePosition == false)) {
    fVar3 = (float)((pCVar2->m_Collision).m_Width << 5) + -200.0;
    fVar4 = (this->m_MousePos).field_0.x;
    fVar1 = (this->m_MousePos).field_1.y;
    if (fVar4 <= fVar3) {
      fVar3 = fVar4;
    }
    (this->m_MousePos).field_0 =
         (anon_union_4_2_94730284_for_vector2_base<float>_1)
         (-(uint)(fVar4 < 200.0) & 0x43480000 | ~-(uint)(fVar4 < 200.0) & (uint)fVar3);
    fVar4 = (float)((pCVar2->m_Collision).m_Height << 5) + -200.0;
    if (fVar1 <= fVar4) {
      fVar4 = fVar1;
    }
    (this->m_MousePos).field_1 =
         (anon_union_4_2_947302a4_for_vector2_base<float>_3)
         (-(uint)(fVar1 < 200.0) & 0x43480000 | ~-(uint)(fVar1 < 200.0) & (uint)fVar4);
  }
  else {
    fVar3 = GetMaxMouseDistance(this);
    fVar4 = (this->m_MousePos).field_0.x;
    uVar5 = 0;
    fVar1 = (this->m_MousePos).field_1.y;
    fVar4 = fVar4 * fVar4 + fVar1 * fVar1;
    if (fVar3 * fVar3 < fVar4) {
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
        uVar5 = extraout_XMM0_Db;
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      auVar6._8_8_ = 0;
      auVar6._0_4_ = (this->m_MousePos).field_0;
      auVar6._4_4_ = (this->m_MousePos).field_1;
      auVar7._4_4_ = fVar4;
      auVar7._0_4_ = fVar4;
      auVar7._8_4_ = uVar5;
      auVar7._12_4_ = uVar5;
      auVar7 = divps(auVar6,auVar7);
      vVar8.field_0.x = fVar3 * auVar7._0_4_;
      vVar8.field_1.y = fVar3 * auVar7._4_4_;
      this->m_MousePos = vVar8;
    }
  }
  return;
}

Assistant:

void CControls::ClampMousePos()
{
	if(m_pClient->m_Snap.m_SpecInfo.m_Active && !m_pClient->m_Snap.m_SpecInfo.m_UsePosition)
	{
		m_MousePos.x = clamp(m_MousePos.x, 200.0f, Collision()->GetWidth()*32-200.0f);
		m_MousePos.y = clamp(m_MousePos.y, 200.0f, Collision()->GetHeight()*32-200.0f);
	}
	else
	{
		const float MouseMax = GetMaxMouseDistance();
		if(dot(m_MousePos, m_MousePos) > MouseMax * MouseMax)
			m_MousePos = normalize(m_MousePos) * MouseMax;
	}
}